

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_palloc.c
# Opt level: O1

void * ngx_palloc_large(ngx_pool_t *pool,size_t size)

{
  ngx_pool_t **ppnVar1;
  ngx_pool_t *pnVar2;
  ulong uVar3;
  void *__ptr;
  ngx_pool_t *pnVar4;
  long lVar5;
  ngx_pool_large_t *pnVar6;
  ngx_pool_t *pnVar7;
  size_t size_00;
  
  __ptr = ngx_alloc(size,pool->log);
  if (__ptr != (void *)0x0) {
    pnVar6 = pool->large;
    if (pnVar6 != (ngx_pool_large_t *)0x0) {
      lVar5 = 5;
      do {
        if (pnVar6->alloc == (void *)0x0) {
          pnVar6->alloc = __ptr;
          return __ptr;
        }
        lVar5 = lVar5 + -1;
      } while ((lVar5 != 0) && (pnVar6 = pnVar6->next, pnVar6 != (ngx_pool_large_t *)0x0));
    }
    pnVar4 = pool->current;
    do {
      pnVar6 = (ngx_pool_large_t *)((ulong)((pnVar4->d).last + 7) & 0xfffffffffffffff8);
      if (0xf < (ulong)((long)(pnVar4->d).end - (long)pnVar6)) {
        (pnVar4->d).last = (u_char *)(pnVar6 + 1);
        goto LAB_001141af;
      }
      pnVar4 = (pnVar4->d).next;
    } while (pnVar4 != (ngx_pool_t *)0x0);
    size_00 = (long)(pool->d).end - (long)pool;
    pnVar4 = (ngx_pool_t *)ngx_memalign(0x10,size_00,pool->log);
    if (pnVar4 == (ngx_pool_t *)0x0) {
      pnVar6 = (ngx_pool_large_t *)0x0;
    }
    else {
      (pnVar4->d).end = (u_char *)(size_00 + (long)pnVar4);
      pnVar6 = (ngx_pool_large_t *)((ulong)((long)&pnVar4->max + 7U) & 0xfffffffffffffff8);
      (pnVar4->d).next = (ngx_pool_t *)0x0;
      (pnVar4->d).failed = 0;
      (pnVar4->d).last = (u_char *)(pnVar6 + 1);
      pnVar7 = pool->current;
      while( true ) {
        ppnVar1 = &(pnVar7->d).next;
        pnVar2 = (pnVar7->d).next;
        if (pnVar2 == (ngx_pool_t *)0x0) break;
        uVar3 = (pnVar7->d).failed;
        (pnVar7->d).failed = uVar3 + 1;
        if (4 < uVar3) {
          pool->current = pnVar2;
        }
        pnVar7 = *ppnVar1;
      }
      *ppnVar1 = pnVar4;
    }
LAB_001141af:
    if (pnVar6 != (ngx_pool_large_t *)0x0) {
      pnVar6->alloc = __ptr;
      pnVar6->next = pool->large;
      pool->large = pnVar6;
      return __ptr;
    }
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

static void *
ngx_palloc_large(ngx_pool_t *pool, size_t size)
{
    void              *p;
    ngx_uint_t         n;
    ngx_pool_large_t  *large;

    p = ngx_alloc(size, pool->log);
    if (p == NULL) {
        return NULL;
    }

    n = 0;

    for (large = pool->large; large; large = large->next) {
        if (large->alloc == NULL) {
            large->alloc = p;
            return p;
        }

        if (n++ > 3) {
            break;
        }
    }

    large = ngx_palloc_small(pool, sizeof(ngx_pool_large_t), 1);
    if (large == NULL) {
        ngx_free(p);
        return NULL;
    }

    large->alloc = p;
    large->next = pool->large;
    pool->large = large;

    return p;
}